

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall
SQInstance::SQInstance(SQInstance *this,SQSharedState *ss,SQInstance *i,SQInteger memsize)

{
  SQUnsignedInteger SVar1;
  undefined8 in_RCX;
  long in_RDX;
  undefined8 *in_RDI;
  SQUnsignedInteger n;
  SQUnsignedInteger nvalues;
  SQSharedState *in_stack_ffffffffffffff68;
  SQInstance *in_stack_ffffffffffffff70;
  SQObjectPtr *local_48;
  ulong local_40;
  
  SQDelegable::SQDelegable(&in_stack_ffffffffffffff70->super_SQDelegable);
  *in_RDI = &PTR__SQInstance_00158498;
  local_48 = (SQObjectPtr *)(in_RDI + 0xb);
  do {
    ::SQObjectPtr::SQObjectPtr(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != (SQObjectPtr *)(in_RDI + 0xd));
  in_RDI[10] = in_RCX;
  in_RDI[7] = *(undefined8 *)(in_RDX + 0x38);
  SVar1 = sqvector<SQClassMember>::size((sqvector<SQClassMember> *)(in_RDI[7] + 0x40));
  for (local_40 = 0; local_40 < SVar1; local_40 = local_40 + 1) {
    ::SQObjectPtr::SQObjectPtr
              ((SQObjectPtr *)(in_RDI + local_40 * 2 + 0xb),
               (SQObjectPtr *)(in_RDX + 0x58 + local_40 * 0x10));
  }
  Init(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  return;
}

Assistant:

SQInstance::SQInstance(SQSharedState *ss, SQInstance *i, SQInteger memsize)
{
    _memsize = memsize;
    _class = i->_class;
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    for(SQUnsignedInteger n = 0; n < nvalues; n++) {
        new (&_values[n]) SQObjectPtr(i->_values[n]);
    }
    Init(ss);
}